

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quote_collector.cpp
# Opt level: O2

void skiwi::collect_quotes(Program *prog,repl_data *data)

{
  _Rb_tree_header *p_Var1;
  pointer pvVar2;
  iterator iVar3;
  _Base_ptr p_Var4;
  Expressions *__range2;
  variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
  *exp;
  pointer exp_00;
  quote_collector_visitor qcv;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>
  q;
  
  if (prog->quotes_collected != true) {
    p_Var1 = &qcv.collected_quotes._M_t._M_impl.super__Rb_tree_header;
    qcv.super_base_visitor<skiwi::(anonymous_namespace)::quote_collector_visitor>._vptr_base_visitor
         = (_func_int **)&PTR__previsit_002ac990;
    qcv.collected_quotes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    qcv.collected_quotes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    qcv.collected_quotes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pvVar2 = (prog->expressions).
             super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    exp_00 = (prog->expressions).
             super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    qcv.collected_quotes._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    qcv.collected_quotes._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    for (; exp_00 != pvVar2; exp_00 = exp_00 + 1) {
      visitor<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_skiwi::(anonymous_namespace)::quote_collector_visitor>
      ::visit(exp_00,&qcv);
    }
    (*qcv.super_base_visitor<skiwi::(anonymous_namespace)::quote_collector_visitor>.
      _vptr_base_visitor[0x31])(&qcv,prog);
    prog->quotes_collected = true;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>_>_>
    ::clear(&(prog->quotes)._M_t);
    for (p_Var4 = qcv.collected_quotes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != p_Var1; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>
      ::pair(&q,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>
                 *)(p_Var4 + 1));
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              ::find(&(data->quote_to_index)._M_t,&q.first);
      if ((_Rb_tree_header *)iVar3._M_node ==
          &(data->quote_to_index)._M_t._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,skiwi::cell>,std::_Select1st<std::pair<std::__cxx11::string_const,skiwi::cell>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,skiwi::cell>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string_const,skiwi::cell>&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,skiwi::cell>,std::_Select1st<std::pair<std::__cxx11::string_const,skiwi::cell>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,skiwi::cell>>>
                    *)&prog->quotes,&q);
      }
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>
      ::~pair(&q);
    }
    anon_unknown_2::quote_collector_visitor::~quote_collector_visitor(&qcv);
    return;
  }
  __assert_fail("!prog.quotes_collected",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/quote_collector.cpp"
                ,0x1d,"void skiwi::collect_quotes(Program &, repl_data &)");
}

Assistant:

void collect_quotes(Program& prog, repl_data& data)
  {
  assert(!prog.quotes_collected);
  quote_collector_visitor qcv;
  visitor<Program, quote_collector_visitor>::visit(prog, &qcv);  
  prog.quotes_collected = true;
  prog.quotes.clear();
  for (auto q : qcv.collected_quotes)
    {    
    if (data.quote_to_index.find(q.first) == data.quote_to_index.end())
      prog.quotes.insert(q);
    }  
  }